

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O0

void __thiscall
Encapsulation_hierarchyCircular_Test::Encapsulation_hierarchyCircular_Test
          (Encapsulation_hierarchyCircular_Test *this)

{
  Encapsulation_hierarchyCircular_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Encapsulation_hierarchyCircular_Test_0013a8f8;
  return;
}

Assistant:

TEST(Encapsulation, hierarchyCircular)
{
    const std::string e_parent_1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e_parent_2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent_component\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <component name=\"child2\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent_component\">\n"
        "      <component_ref component=\"child1\">\n"
        "        <component_ref component=\"child2\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    parent->setName("parent_component");
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    child1->setName("child1");
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    child2->setName("child2");

    // Standard addition of one component onto another.
    parent->addComponent(child1);
    EXPECT_EQ(size_t(0), child1->componentCount());
    EXPECT_EQ(size_t(1), parent->componentCount());

    // Can't make this circular hierarchy 'parent' will not be added as a child
    // of 'child1'. Everything will remain as it is.
    child1->addComponent(parent);
    EXPECT_EQ(size_t(0), child1->componentCount());
    EXPECT_EQ(size_t(1), parent->componentCount());

    // Add the 'parent' component onto the model to make a
    // waterfall hierarchy of two steps.
    model->addComponent(parent);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent_1, a_parent);

    // Add 'child2' to 'child1' to make a waterfall hierarchy of
    // three steps.
    EXPECT_TRUE(child1->addComponent(child2));
    a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent_2, a_parent);

    // Try to make a circular hierarchy but we will not succeed as this is not
    // allowed.  The model will stay as it is.
    EXPECT_FALSE(child2->addComponent(parent));
    EXPECT_FALSE(parent->hasAncestor(child2));
    a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent_2, a_parent);
}